

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyT<short>::push_back(PropertyT<short> *this)

{
  short local_a;
  
  local_a = 0;
  std::vector<short,_std::allocator<short>_>::emplace_back<short>(&this->data_,&local_a);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }